

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O1

bool rgbcx::unpack_bc1(void *pBlock_bits,void *pPixels,bool set_alpha,bc1_approx_mode mode)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  undefined7 in_register_00000011;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  undefined4 local_58;
  undefined1 local_54;
  undefined1 local_53;
  undefined1 local_52;
  undefined1 local_51;
  undefined1 local_50;
  undefined1 local_4f;
  undefined1 local_4e;
  undefined1 local_4d;
  undefined4 local_4c;
  ulong local_48;
  ulong local_40;
  undefined4 local_34;
  
  local_34 = (int)CONCAT71(in_register_00000011,set_alpha);
  bVar1 = *(byte *)((long)pBlock_bits + 1);
  uVar3 = *pBlock_bits;
  bVar2 = *(byte *)((long)pBlock_bits + 3);
  uVar4 = *(ushort *)((long)pBlock_bits + 2);
  uVar7 = uVar3 >> 5 & 0x3f;
  uVar17 = *pBlock_bits & 0x1f;
  uVar15 = (uint)(bVar1 >> 5) | bVar1 & 0xfffffff8;
  uVar7 = (uVar7 >> 4) + uVar7 * 4;
  uVar11 = uVar4 >> 5 & 0x3f;
  uVar14 = (uint)(bVar2 >> 5) | bVar2 & 0xfffffff8;
  iVar12 = (uVar11 >> 4) + uVar11 * 4;
  uVar11 = (uVar17 >> 2) + uVar17 * 8;
  uVar16 = *(byte *)((long)pBlock_bits + 2) & 0x1f;
  iVar5 = (uVar16 >> 2) + uVar16 * 8;
  local_58._0_1_ = (char)uVar15;
  local_48 = (ulong)uVar7;
  local_58._1_1_ = (char)uVar7;
  local_40 = (ulong)uVar11;
  local_58._2_1_ = (char)uVar11;
  local_58._3_1_ = 0xff;
  local_54 = (char)uVar14;
  local_53 = (char)iVar12;
  local_52 = (char)iVar5;
  local_51 = 0xff;
  uVar10 = (uint)(bVar1 >> 3);
  uVar13 = (uint)(bVar2 >> 3);
  if (uVar3 <= uVar4) {
    switch(mode) {
    case cBC1Ideal:
    case cBC1IdealRound4:
      local_50 = (undefined1)(uVar14 + uVar15 >> 1);
      local_4f = (undefined1)(iVar12 + uVar7 >> 1);
      local_4e = (undefined1)(iVar5 + uVar11 >> 1);
      break;
    case cBC1NVidia:
      local_50 = (undefined1)((uVar13 + uVar10) * 0x21 >> 3);
      iVar12 = iVar12 - uVar7;
      iVar5 = iVar12 + 3;
      if (-1 < iVar12) {
        iVar5 = iVar12;
      }
      iVar5 = (iVar5 >> 2) + uVar7 * 0x100;
      iVar8 = iVar12 * 0x80 + iVar5 + 0x80;
      iVar12 = iVar12 * 0x80 + iVar5 + 0x17f;
      if (-1 < iVar8) {
        iVar12 = iVar8;
      }
      local_4f = (undefined1)((uint)iVar12 >> 8);
      local_4e = (undefined1)((uVar16 + uVar17) * 0x21 >> 3);
      break;
    case cBC1AMD:
      local_50 = (undefined1)(uVar14 + uVar15 + 1 >> 1);
      local_4f = (undefined1)(iVar12 + uVar7 + 1 >> 1);
      local_4e = (undefined1)(iVar5 + uVar11 + 1 >> 1);
      break;
    default:
      goto switchD_0011dff5_default;
    }
    local_4d = 0xff;
switchD_0011dff5_default:
    local_4c = 0;
    goto switchD_0011e029_default;
  }
  switch(mode) {
  case cBC1Ideal:
    local_50 = (char)((ulong)(uVar14 + uVar15 * 2) * 0x55555556 >> 0x20);
    local_4f = (char)((ulong)(iVar12 + uVar7 * 2) * 0x55555556 >> 0x20);
    local_4e = (char)((ulong)(iVar5 + uVar11 * 2) * 0x55555556 >> 0x20);
    local_4d = 0xff;
    uVar15 = uVar15 + uVar14 * 2;
    uVar7 = uVar7 + iVar12 * 2;
    uVar11 = uVar11 + iVar5 * 2;
    break;
  case cBC1NVidia:
    iVar8 = iVar12 - uVar7;
    iVar5 = iVar8 + 3;
    if (-1 < iVar8) {
      iVar5 = iVar8;
    }
    iVar8 = iVar8 * 0x50 + uVar7 * 0x100 + (iVar5 >> 2);
    iVar5 = iVar8 + 0x80;
    iVar8 = iVar8 + 0x17f;
    if (-1 < iVar5) {
      iVar8 = iVar5;
    }
    local_50 = (char)((uVar13 + uVar10 * 2) * 0x16 >> 3);
    local_4f = (char)((uint)iVar8 >> 8);
    local_4e = (char)((uVar16 + uVar17 * 2) * 0x16 >> 3);
    iVar8 = uVar7 - iVar12;
    iVar5 = iVar8 + 3;
    if (-1 < iVar8) {
      iVar5 = iVar8;
    }
    local_4d = 0xff;
    iVar12 = iVar8 * 0x50 + iVar12 * 0x100 + (iVar5 >> 2);
    iVar5 = iVar12 + 0x80;
    iVar12 = iVar12 + 0x17f;
    if (-1 < iVar5) {
      iVar12 = iVar5;
    }
    local_4c = CONCAT13(0xff,CONCAT12((char)((uVar17 + uVar16 * 2) * 0x16 >> 3),
                                      CONCAT11((char)((uint)iVar12 >> 8),
                                               (char)((uVar10 + uVar13 * 2) * 0x16 >> 3))));
    goto switchD_0011e029_default;
  case cBC1AMD:
    local_50 = (char)(uVar15 * 0x2b + uVar14 * 0x15 + 0x20 >> 6);
    local_4f = (char)(uVar7 * 0x2b + iVar12 * 0x15 + 0x20 >> 6);
    local_4e = (char)(uVar11 * 0x2b + iVar5 * 0x15 + 0x20 >> 6);
    local_4d = 0xff;
    local_4c._0_3_ =
         CONCAT12((char)(iVar5 * 0x2b + uVar11 * 0x15 + 0x20 >> 6),
                  CONCAT11((char)(iVar12 * 0x2b + uVar7 * 0x15 + 0x20 >> 6),
                           (char)(uVar14 * 0x2b + uVar15 * 0x15 + 0x20 >> 6)));
    goto LAB_0011e2aa;
  case cBC1IdealRound4:
    local_50 = (char)((ulong)(uVar14 + uVar15 * 2 + 1) * 0x55555556 >> 0x20);
    local_4f = (char)((ulong)(iVar12 + uVar7 * 2 + 1) * 0x55555556 >> 0x20);
    local_4e = (char)((ulong)(iVar5 + uVar11 * 2 + 1) * 0x55555556 >> 0x20);
    local_4d = 0xff;
    uVar15 = uVar15 + 1 + uVar14 * 2;
    uVar7 = uVar7 + iVar12 * 2 + 1;
    uVar11 = uVar11 + iVar5 * 2 + 1;
    break;
  default:
    goto switchD_0011e029_default;
  }
  local_4c._0_3_ =
       CONCAT12((char)((ulong)uVar11 * 0x55555556 >> 0x20),
                CONCAT11((char)((ulong)uVar7 * 0x55555556 >> 0x20),
                         (char)((ulong)uVar15 * 0x55555556 >> 0x20)));
LAB_0011e2aa:
  local_4c = CONCAT13(0xff,(undefined3)local_4c);
switchD_0011e029_default:
  if (set_alpha) {
    lVar6 = 0;
    do {
      *(undefined4 *)pPixels = (&local_58)[*(byte *)((long)pBlock_bits + lVar6 + 4) & 3];
      *(undefined4 *)((long)pPixels + 4) =
           *(undefined4 *)
            ((long)&local_58 + (ulong)(*(byte *)((long)pBlock_bits + lVar6 + 4) & 0xc));
      *(undefined4 *)((long)pPixels + 8) =
           *(undefined4 *)
            ((long)&local_58 + (ulong)(*(byte *)((long)pBlock_bits + lVar6 + 4) >> 2 & 0xc));
      *(undefined4 *)((long)pPixels + 0xc) =
           (&local_58)[*(byte *)((long)pBlock_bits + lVar6 + 4) >> 6];
      lVar6 = lVar6 + 1;
      pPixels = (void *)((long)pPixels + 0x10);
    } while (lVar6 != 4);
  }
  else {
    lVar6 = 0;
    do {
      uVar9 = (ulong)(*(byte *)((long)pBlock_bits + lVar6 + 4) & 3);
      *(undefined1 *)pPixels = *(undefined1 *)(&local_58 + uVar9);
      *(undefined1 *)((long)pPixels + 1) = *(undefined1 *)((long)&local_58 + uVar9 * 4 + 1);
      *(undefined1 *)((long)pPixels + 2) = *(undefined1 *)((long)&local_58 + uVar9 * 4 + 2);
      uVar9 = (ulong)(*(byte *)((long)pBlock_bits + lVar6 + 4) & 0xc);
      *(undefined1 *)((long)pPixels + 4) = *(undefined1 *)((long)&local_58 + uVar9);
      *(undefined1 *)((long)pPixels + 5) = *(undefined1 *)((long)&local_58 + uVar9 + 1);
      *(undefined1 *)((long)pPixels + 6) = *(undefined1 *)((long)&local_58 + uVar9 + 2);
      uVar9 = (ulong)(*(byte *)((long)pBlock_bits + lVar6 + 4) >> 2 & 0xc);
      *(undefined1 *)((long)pPixels + 8) = *(undefined1 *)((long)&local_58 + uVar9);
      *(undefined1 *)((long)pPixels + 9) = *(undefined1 *)((long)&local_58 + uVar9 + 1);
      *(undefined1 *)((long)pPixels + 10) = *(undefined1 *)((long)&local_58 + uVar9 + 2);
      uVar9 = (ulong)(*(byte *)((long)pBlock_bits + lVar6 + 4) >> 6);
      *(undefined1 *)((long)pPixels + 0xc) = *(undefined1 *)(&local_58 + uVar9);
      *(undefined1 *)((long)pPixels + 0xd) = *(undefined1 *)((long)&local_58 + uVar9 * 4 + 1);
      *(undefined1 *)((long)pPixels + 0xe) = *(undefined1 *)((long)&local_58 + uVar9 * 4 + 2);
      lVar6 = lVar6 + 1;
      pPixels = (void *)((long)pPixels + 0x10);
    } while (lVar6 != 4);
  }
  return uVar3 <= uVar4;
}

Assistant:

bool unpack_bc1(const void* pBlock_bits, void* pPixels, bool set_alpha, bc1_approx_mode mode)
	{
		color32* pDst_pixels = static_cast<color32*>(pPixels);

		static_assert(sizeof(bc1_block) == 8, "sizeof(bc1_block) == 8");
		static_assert(sizeof(bc4_block) == 8, "sizeof(bc4_block) == 8");

		const bc1_block* pBlock = static_cast<const bc1_block*>(pBlock_bits);

		const uint32_t l = pBlock->get_low_color();
		const uint32_t h = pBlock->get_high_color();

		color32 c[4];

		const int cr0 = (l >> 11) & 31;
		const int cg0 = (l >> 5) & 63;
		const int cb0 = l & 31;
		const int r0 = (cr0 << 3) | (cr0 >> 2);
		const int g0 = (cg0 << 2) | (cg0 >> 4);
		const int b0 = (cb0 << 3) | (cb0 >> 2);

		const int cr1 = (h >> 11) & 31;
		const int cg1 = (h >> 5) & 63;
		const int cb1 = h & 31;
		const int r1 = (cr1 << 3) | (cr1 >> 2);
		const int g1 = (cg1 << 2) | (cg1 >> 4);
		const int b1 = (cb1 << 3) | (cb1 >> 2);

		bool used_punchthrough = false;
				
		if (l > h)
		{
			c[0].set_noclamp_rgba(r0, g0, b0, 255);
			c[1].set_noclamp_rgba(r1, g1, b1, 255);
			switch (mode)
			{
				case bc1_approx_mode::cBC1Ideal:
					c[2].set_noclamp_rgba((r0 * 2 + r1) / 3, (g0 * 2 + g1) / 3, (b0 * 2 + b1) / 3, 255);
					c[3].set_noclamp_rgba((r1 * 2 + r0) / 3, (g1 * 2 + g0) / 3, (b1 * 2 + b0) / 3, 255);
					break;
				case bc1_approx_mode::cBC1IdealRound4:
					c[2].set_noclamp_rgba((r0 * 2 + r1 + 1) / 3, (g0 * 2 + g1 + 1) / 3, (b0 * 2 + b1 + 1) / 3, 255);
					c[3].set_noclamp_rgba((r1 * 2 + r0 + 1) / 3, (g1 * 2 + g0 + 1) / 3, (b1 * 2 + b0 + 1) / 3, 255);
					break;
				case bc1_approx_mode::cBC1NVidia:
					c[2].set_noclamp_rgba(interp_5_nv(cr0, cr1), interp_6_nv(g0, g1), interp_5_nv(cb0, cb1), 255);
					c[3].set_noclamp_rgba(interp_5_nv(cr1, cr0), interp_6_nv(g1, g0), interp_5_nv(cb1, cb0), 255);
					break;
				case bc1_approx_mode::cBC1AMD:
					c[2].set_noclamp_rgba(interp_5_6_amd(r0, r1), interp_5_6_amd(g0, g1), interp_5_6_amd(b0, b1), 255);
					c[3].set_noclamp_rgba(interp_5_6_amd(r1, r0), interp_5_6_amd(g1, g0), interp_5_6_amd(b1, b0), 255);
					break;
			}
		}
		else
		{
			c[0].set_noclamp_rgba(r0, g0, b0, 255);
			c[1].set_noclamp_rgba(r1, g1, b1, 255);
			switch (mode)
			{
				case bc1_approx_mode::cBC1Ideal:
				case bc1_approx_mode::cBC1IdealRound4:
					c[2].set_noclamp_rgba((r0 + r1) / 2, (g0 + g1) / 2, (b0 + b1) / 2, 255);
					break;
				case bc1_approx_mode::cBC1NVidia:
					c[2].set_noclamp_rgba(interp_half_5_nv(cr0, cr1), interp_half_6_nv(g0, g1), interp_half_5_nv(cb0, cb1), 255);
					break;
				case bc1_approx_mode::cBC1AMD:
					c[2].set_noclamp_rgba(interp_half_5_6_amd(r0, r1), interp_half_5_6_amd(g0, g1), interp_half_5_6_amd(b0, b1), 255);
					break;
			}

			c[3].set_noclamp_rgba(0, 0, 0, 0);
			used_punchthrough = true;
		}

		if (set_alpha)
		{
			for (uint32_t y = 0; y < 4; y++, pDst_pixels += 4)
			{
				pDst_pixels[0] = c[pBlock->get_selector(0, y)];
				pDst_pixels[1] = c[pBlock->get_selector(1, y)];
				pDst_pixels[2] = c[pBlock->get_selector(2, y)];
				pDst_pixels[3] = c[pBlock->get_selector(3, y)];
			}
		}
		else
		{
			for (uint32_t y = 0; y < 4; y++, pDst_pixels += 4)
			{
				pDst_pixels[0].set_rgb(c[pBlock->get_selector(0, y)]);
				pDst_pixels[1].set_rgb(c[pBlock->get_selector(1, y)]);
				pDst_pixels[2].set_rgb(c[pBlock->get_selector(2, y)]);
				pDst_pixels[3].set_rgb(c[pBlock->get_selector(3, y)]);
			}
		}

		return used_punchthrough;
	}